

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_long,long>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          long *out_value)

{
  long *plVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = *(uint *)&this->num_components_;
  bVar2 = out_num_components;
  if ((byte)uVar5 < out_num_components) {
    bVar2 = (byte)uVar5;
  }
  bVar6 = bVar2 == 0;
  if (bVar6) {
LAB_0014c540:
    if ((byte)uVar5 < out_num_components) {
      memset(out_value + (uVar5 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar5 & 0xff)) * 8 + 8);
    }
  }
  else {
    plVar3 = (long *)((this->buffer_->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                     this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    plVar1 = (long *)(this->buffer_->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (plVar3 < plVar1) {
      uVar4 = 1;
      do {
        if (*plVar3 < 0) {
          return bVar6;
        }
        out_value[uVar4 - 1] = *plVar3;
        uVar5 = *(uint *)&this->num_components_;
        bVar2 = (byte)uVar5;
        if (out_num_components <= (byte)uVar5) {
          bVar2 = out_num_components;
        }
        bVar6 = bVar2 <= uVar4;
        if (bVar6) goto LAB_0014c540;
        plVar3 = plVar3 + 1;
        uVar4 = uVar4 + 1;
      } while (plVar3 < plVar1);
    }
  }
  return bVar6;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }